

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O1

int GetWordVector(void *hPtr,char *input,float **vector)

{
  int iVar1;
  float *__dest;
  Vector svec;
  string wordStr;
  Vector local_70;
  string local_60;
  allocator<char> local_40 [32];
  
  iVar1 = fasttext::FastText::getDimension((FastText *)hPtr);
  fasttext::Vector::Vector(&local_70,(long)iVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,input,local_40);
  fasttext::FastText::getWordVector((FastText *)hPtr,&local_70,&local_60);
  __dest = (float *)operator_new__(-(ulong)(local_70.data_.size_ >> 0x3e != 0) |
                                   local_70.data_.size_ * 4);
  memcpy(__dest,local_70.data_.mem_,local_70.data_.size_ * 4);
  *vector = __dest;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  free(local_70.data_.mem_);
  return (int)local_70.data_.size_;
}

Assistant:

GetWordVector(void* hPtr, const char* input, float** vector)
{
    auto fastText = static_cast<FastTextWrapper*>(hPtr);
    Vector svec(fastText->getDimension());
    std::string wordStr(input);

    try {
        fastText->getWordVector(svec, wordStr);
    }
    catch (std::exception& e) {
        _lastError = std::string(e.what());
        return -1;
    }
    catch (...) {
        _lastError = "Unknown error";
        return -1;
    }

    auto vec = new float[svec.size()];
    size_t sz = sizeof(float)*svec.size();
    memcpy(vec, svec.data(), sz);

    *vector = vec;

    return (int) svec.size();
}